

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O3

void Gia_ManPrintGetMuxFanins(Gia_Man_t *p,Gia_Obj_t *pObj,int *pFanins)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *local_20;
  Gia_Obj_t *local_18;
  
  pGVar2 = Gia_ObjRecognizeMux(pObj,&local_20,&local_18);
  pGVar2 = (Gia_Obj_t *)((ulong)pGVar2 & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar2) && (pGVar2 < pGVar1 + p->nObjs)) {
    *pFanins = (int)((ulong)((long)pGVar2 - (long)pGVar1) >> 2) * -0x55555555;
    local_20 = (Gia_Obj_t *)((ulong)local_20 & 0xfffffffffffffffe);
    if ((pGVar1 <= local_20) && (local_20 < pGVar1 + p->nObjs)) {
      pFanins[1] = (int)((ulong)((long)local_20 - (long)pGVar1) >> 2) * -0x55555555;
      local_18 = (Gia_Obj_t *)((ulong)local_18 & 0xfffffffffffffffe);
      if ((pGVar1 <= local_18) && (local_18 < pGVar1 + p->nObjs)) {
        pFanins[2] = (int)((ulong)((long)local_18 - (long)pGVar1) >> 2) * -0x55555555;
        return;
      }
    }
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

void Gia_ManPrintGetMuxFanins( Gia_Man_t * p, Gia_Obj_t * pObj, int * pFanins )
{
    Gia_Obj_t * pData0, * pData1;
    Gia_Obj_t * pCtrl = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
    pFanins[0] = Gia_ObjId(p, Gia_Regular(pCtrl));
    pFanins[1] = Gia_ObjId(p, Gia_Regular(pData1));
    pFanins[2] = Gia_ObjId(p, Gia_Regular(pData0));
}